

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::
ValidateNamingStyle<google::protobuf::EnumValueDescriptor,google::protobuf::EnumValueDescriptorProto>
          (DescriptorBuilder *this,EnumValueDescriptor *enum_value,EnumValueDescriptorProto *proto)

{
  anon_unknown_24 *this_00;
  char *pcVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar2;
  anon_unknown_24 *paVar3;
  char *pcVar4;
  string_view name;
  string_view element_name;
  string error;
  EnumValueDescriptor *local_68;
  VoidPtr local_60;
  code *pcStack_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  LogMessageFatal local_30;
  
  local_48 = 0;
  local_40 = 0;
  this_00 = (anon_unknown_24 *)enum_value->all_names_->_M_string_length;
  local_68 = enum_value;
  local_50 = &local_40;
  if (this_00 == (anon_unknown_24 *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x23fa,"!name.empty()");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
  }
  pcVar1 = (enum_value->all_names_->_M_dataplus)._M_p;
  paVar3 = (anon_unknown_24 *)0x0;
  pcVar4 = "should be UPPER_SNAKE_CASE";
  do {
    if ((*(ulong *)(&DAT_004357a0 + (ulong)((byte)pcVar1[(long)paVar3] >> 6) * 8) >>
         ((ulong)(byte)pcVar1[(long)paVar3] & 0x3f) & 1) == 0) goto LAB_002271df;
    paVar3 = paVar3 + 1;
  } while (this_00 != paVar3);
  if ((byte)(*pcVar1 + 0xbfU) < 0x1a) {
    name._M_str = "";
    name._M_len = (size_t)pcVar1;
    bVar2 = anon_unknown_24::ContainsBadUnderscores(this_00,name);
    if (!bVar2) goto LAB_00227237;
    pcVar4 = "contains style violating underscores";
  }
  else {
    pcVar4 = "should begin with an upper case letter";
  }
LAB_002271df:
  std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,(ulong)pcVar4);
  local_30.super_LogMessage._0_8_ = &local_68;
  local_60.obj = &local_30;
  pcStack_58 = absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::EnumValueDescriptor,google::protobuf::EnumValueDescriptorProto>(google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptorProto_const&)::__0,std::__cxx11::string>
  ;
  make_error.invoker_ =
       absl::lts_20250127::functional_internal::
       InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::EnumValueDescriptor,google::protobuf::EnumValueDescriptorProto>(google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptorProto_const&)::__0,std::__cxx11::string>
  ;
  make_error.ptr_.obj = local_60.obj;
  element_name._M_str = (local_68->all_names_->_M_dataplus)._M_p;
  element_name._M_len = local_68->all_names_->_M_string_length;
  local_30.super_LogMessage.data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )&local_50;
  AddError(this,element_name,&proto->super_Message,NAME,make_error);
LAB_00227237:
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateNamingStyle(
    const EnumValueDescriptor* enum_value,
    const EnumValueDescriptorProto& proto) {
  std::string error;
  if (!IsValidUpperSnakeCaseName(enum_value->name(), &error)) {
    AddError(enum_value->name(), proto, DescriptorPool::ErrorCollector::NAME,
             [&] {
               return absl::StrCat("Enum value name ", enum_value->name(), " ",
                                   error, kNamingStyleOptOutMessage);
             });
  }
}